

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O2

void __thiscall wasm::InstrumentLocals::visitModule(InstrumentLocals *this,Module *curr)

{
  size_t sVar1;
  char *pcVar2;
  Type TVar3;
  Type TVar4;
  uint uVar5;
  initializer_list<wasm::Type> types;
  initializer_list<wasm::Type> types_00;
  initializer_list<wasm::Type> types_01;
  initializer_list<wasm::Type> types_02;
  initializer_list<wasm::Type> types_03;
  initializer_list<wasm::Type> types_04;
  initializer_list<wasm::Type> types_05;
  initializer_list<wasm::Type> types_06;
  initializer_list<wasm::Type> types_07;
  initializer_list<wasm::Type> types_08;
  initializer_list<wasm::Type> types_09;
  initializer_list<wasm::Type> types_10;
  initializer_list<wasm::Type> types_11;
  initializer_list<wasm::Type> types_12;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  Name name_06;
  Name name_07;
  Name name_08;
  Name name_09;
  Name name_10;
  Name name_11;
  Name name_12;
  Type local_f0;
  Type local_e8;
  Type local_e0;
  Type local_d8;
  Type local_d0;
  Type local_c8;
  Type local_c0;
  Type local_b8;
  Type local_b0;
  Type local_a8;
  Type local_a0;
  Type local_98;
  Type local_90;
  Type local_88;
  char *local_80;
  Type local_78;
  Type func;
  Type local_68;
  Type ext;
  Type local_58;
  undefined8 uStack_50;
  uintptr_t local_48;
  char *local_38;
  
  sVar1 = get_i32;
  ext.id = DAT_00e63678;
  local_58.id = 2;
  uStack_50 = 2;
  local_48 = 2;
  types._M_len = 3;
  types._M_array = &local_58;
  wasm::Type::Type(&local_f0,types);
  name.super_IString.str._M_str = (char *)ext.id;
  name.super_IString.str._M_len = sVar1;
  addImport(this,curr,name,local_f0,(Type)0x2);
  pcVar2 = DAT_00e63688;
  sVar1 = get_i64;
  local_58.id = 2;
  uStack_50 = 2;
  local_48 = 3;
  types_00._M_len = 3;
  types_00._M_array = &local_58;
  wasm::Type::Type(&local_e8,types_00);
  name_00.super_IString.str._M_str = pcVar2;
  name_00.super_IString.str._M_len = sVar1;
  addImport(this,curr,name_00,local_e8,(Type)0x3);
  pcVar2 = DAT_00e63698;
  sVar1 = get_f32;
  local_58.id = 2;
  uStack_50 = 2;
  local_48 = 4;
  types_01._M_len = 3;
  types_01._M_array = &local_58;
  wasm::Type::Type(&local_e0,types_01);
  name_01.super_IString.str._M_str = pcVar2;
  name_01.super_IString.str._M_len = sVar1;
  addImport(this,curr,name_01,local_e0,(Type)0x4);
  pcVar2 = DAT_00e636a8;
  sVar1 = get_f64;
  local_58.id = 2;
  uStack_50 = 2;
  local_48 = 5;
  types_02._M_len = 3;
  types_02._M_array = &local_58;
  wasm::Type::Type(&local_d8,types_02);
  name_02.super_IString.str._M_str = pcVar2;
  name_02.super_IString.str._M_len = sVar1;
  addImport(this,curr,name_02,local_d8,(Type)0x5);
  pcVar2 = DAT_00e636e8;
  sVar1 = set_i32;
  local_58.id = 2;
  uStack_50 = 2;
  local_48 = 2;
  types_03._M_len = 3;
  types_03._M_array = &local_58;
  wasm::Type::Type(&local_d0,types_03);
  name_03.super_IString.str._M_str = pcVar2;
  name_03.super_IString.str._M_len = sVar1;
  addImport(this,curr,name_03,local_d0,(Type)0x2);
  pcVar2 = DAT_00e636f8;
  sVar1 = set_i64;
  local_58.id = 2;
  uStack_50 = 2;
  local_48 = 3;
  types_04._M_len = 3;
  types_04._M_array = &local_58;
  wasm::Type::Type(&local_c8,types_04);
  name_04.super_IString.str._M_str = pcVar2;
  name_04.super_IString.str._M_len = sVar1;
  addImport(this,curr,name_04,local_c8,(Type)0x3);
  pcVar2 = DAT_00e63708;
  sVar1 = set_f32;
  local_58.id = 2;
  uStack_50 = 2;
  local_48 = 4;
  types_05._M_len = 3;
  types_05._M_array = &local_58;
  wasm::Type::Type(&local_c0,types_05);
  name_05.super_IString.str._M_str = pcVar2;
  name_05.super_IString.str._M_len = sVar1;
  addImport(this,curr,name_05,local_c0,(Type)0x4);
  pcVar2 = DAT_00e63718;
  sVar1 = set_f64;
  local_58.id = 2;
  uStack_50 = 2;
  local_48 = 5;
  types_06._M_len = 3;
  types_06._M_array = &local_58;
  wasm::Type::Type(&local_b8,types_06);
  name_06.super_IString.str._M_str = pcVar2;
  name_06.super_IString.str._M_len = sVar1;
  ext.id = (uintptr_t)this;
  addImport(this,curr,name_06,local_b8,(Type)0x5);
  uVar5 = (curr->features).features;
  func.id = (uintptr_t)curr;
  if ((uVar5 >> 8 & 1) != 0) {
    wasm::Type::Type(&local_78,(HeapType)0x1,Nullable);
    wasm::Type::Type(&local_68,(HeapType)0x0,Nullable);
    pcVar2 = DAT_00e636c8;
    local_38 = (char *)get_funcref;
    local_58.id = 2;
    uStack_50 = 2;
    local_48 = local_78.id;
    types_07._M_len = 3;
    types_07._M_array = &local_58;
    wasm::Type::Type(&local_b0,types_07);
    TVar4 = ext;
    TVar3 = func;
    name_07.super_IString.str._M_str = pcVar2;
    name_07.super_IString.str._M_len = (size_t)local_38;
    addImport((InstrumentLocals *)ext.id,(Module *)func.id,name_07,local_b0,local_78);
    pcVar2 = DAT_00e63738;
    local_38 = (char *)set_funcref;
    local_58.id = 2;
    uStack_50 = 2;
    local_48 = local_78.id;
    types_08._M_len = 3;
    types_08._M_array = &local_58;
    wasm::Type::Type(&local_a8,types_08);
    name_08.super_IString.str._M_str = pcVar2;
    name_08.super_IString.str._M_len = (size_t)local_38;
    addImport((InstrumentLocals *)TVar4.id,(Module *)TVar3.id,name_08,local_a8,local_78);
    local_38 = (char *)get_externref;
    local_80 = DAT_00e636d8;
    local_58.id = 2;
    uStack_50 = 2;
    local_48 = local_68.id;
    types_09._M_len = 3;
    types_09._M_array = &local_58;
    wasm::Type::Type(&local_a0,types_09);
    name_09.super_IString.str._M_str = local_80;
    name_09.super_IString.str._M_len = (size_t)local_38;
    addImport((InstrumentLocals *)TVar4.id,(Module *)TVar3.id,name_09,local_a0,local_68);
    pcVar2 = DAT_00e63748;
    local_38 = (char *)set_externref;
    local_58.id = 2;
    uStack_50 = 2;
    local_48 = local_68.id;
    types_10._M_len = 3;
    types_10._M_array = &local_58;
    wasm::Type::Type(&local_98,types_10);
    name_10.super_IString.str._M_str = pcVar2;
    name_10.super_IString.str._M_len = (size_t)local_38;
    addImport((InstrumentLocals *)TVar4.id,(Module *)TVar3.id,name_10,local_98,local_68);
    uVar5 = *(uint *)(TVar3.id + 0x108);
  }
  sVar1 = get_v128;
  if ((uVar5 & 8) != 0) {
    local_38 = DAT_00e636b8;
    local_58.id = 2;
    uStack_50 = 2;
    local_48 = 6;
    types_11._M_len = 3;
    types_11._M_array = &local_58;
    wasm::Type::Type(&local_90,types_11);
    TVar4 = ext;
    TVar3 = func;
    name_11.super_IString.str._M_str = local_38;
    name_11.super_IString.str._M_len = sVar1;
    addImport((InstrumentLocals *)ext.id,(Module *)func.id,name_11,local_90,(Type)0x6);
    pcVar2 = DAT_00e63728;
    sVar1 = set_v128;
    local_58.id = 2;
    uStack_50 = 2;
    local_48 = 6;
    types_12._M_len = 3;
    types_12._M_array = &local_58;
    wasm::Type::Type(&local_88,types_12);
    name_12.super_IString.str._M_str = pcVar2;
    name_12.super_IString.str._M_len = sVar1;
    addImport((InstrumentLocals *)TVar4.id,(Module *)TVar3.id,name_12,local_88,(Type)0x6);
  }
  return;
}

Assistant:

void visitModule(Module* curr) {
    addImport(curr, get_i32, {Type::i32, Type::i32, Type::i32}, Type::i32);
    addImport(curr, get_i64, {Type::i32, Type::i32, Type::i64}, Type::i64);
    addImport(curr, get_f32, {Type::i32, Type::i32, Type::f32}, Type::f32);
    addImport(curr, get_f64, {Type::i32, Type::i32, Type::f64}, Type::f64);
    addImport(curr, set_i32, {Type::i32, Type::i32, Type::i32}, Type::i32);
    addImport(curr, set_i64, {Type::i32, Type::i32, Type::i64}, Type::i64);
    addImport(curr, set_f32, {Type::i32, Type::i32, Type::f32}, Type::f32);
    addImport(curr, set_f64, {Type::i32, Type::i32, Type::f64}, Type::f64);

    if (curr->features.hasReferenceTypes()) {
      Type func = Type(HeapType::func, Nullable);
      Type ext = Type(HeapType::ext, Nullable);

      addImport(curr, get_funcref, {Type::i32, Type::i32, func}, func);
      addImport(curr, set_funcref, {Type::i32, Type::i32, func}, func);
      addImport(curr, get_externref, {Type::i32, Type::i32, ext}, ext);
      addImport(curr, set_externref, {Type::i32, Type::i32, ext}, ext);
    }
    if (curr->features.hasSIMD()) {
      addImport(curr, get_v128, {Type::i32, Type::i32, Type::v128}, Type::v128);
      addImport(curr, set_v128, {Type::i32, Type::i32, Type::v128}, Type::v128);
    }
  }